

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirePdu.cpp
# Opt level: O3

void __thiscall DIS::FirePdu::marshal(FirePdu *this,DataStream *dataStream)

{
  WarfareFamilyPdu::marshal(&this->super_WarfareFamilyPdu,dataStream);
  EntityID::marshal(&this->_munitionExpendibleID,dataStream);
  EventIdentifier::marshal(&this->_eventID,dataStream);
  DataStream::operator<<(dataStream,this->_fireMissionIndex);
  Vector3Double::marshal(&this->_locationInWorldCoordinates,dataStream);
  MunitionDescriptor::marshal(&this->_descriptor,dataStream);
  Vector3Float::marshal(&this->_velocity,dataStream);
  DataStream::operator<<(dataStream,this->_range);
  return;
}

Assistant:

void FirePdu::marshal(DataStream& dataStream) const
{
    WarfareFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _munitionExpendibleID.marshal(dataStream);
    _eventID.marshal(dataStream);
    dataStream << _fireMissionIndex;
    _locationInWorldCoordinates.marshal(dataStream);
    _descriptor.marshal(dataStream);
    _velocity.marshal(dataStream);
    dataStream << _range;
}